

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtable_test.cpp
# Opt level: O0

int main(void)

{
  initializer_list<copy_on_write<printable_vtable>_> __l;
  initializer_list<printable_vtable> __l_00;
  bool bVar1;
  ostream *poVar2;
  size_t *psVar3;
  reference_wrapper<hi_printable> value;
  reference_wrapper<large_printable> value_00;
  reference_wrapper<bye_printable> value_01;
  reference_wrapper<const_hi_printable> value_02;
  reference_wrapper<const_large_printable> value_03;
  reference this;
  value_type *this_00;
  copy_on_write<printable_vtable> *pcStack_2d098;
  printable_vtable *ppStack_2d030;
  undefined1 auStack_2cba8 [8];
  vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
  several_printables_copy_1;
  copy_on_write<printable_vtable> *printable_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
  *__range1_1;
  large_printable lStack_2cb68;
  printable_vtable pStack_2ab50;
  printable_vtable pStack_2ab20;
  copy_on_write<printable_vtable> *pcStack_2aaf8;
  undefined1 auStack_2aaf0 [32];
  copy_on_write<printable_vtable> cStack_2aad0;
  undefined1 auStack_2aac0 [8];
  vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
  several_printables_1;
  vector<printable_vtable,_std::allocator<printable_vtable>_> several_printables_copy;
  printable_vtable *printable;
  iterator __end1;
  iterator __begin1;
  vector<printable_vtable,_std::allocator<printable_vtable>_> *__range1;
  large_printable lStack_2aa68;
  printable_vtable *ppStack_28a48;
  printable_vtable pStack_28a40;
  printable_vtable pStack_28a18;
  undefined1 auStack_289f0 [24];
  vector<printable_vtable,_std::allocator<printable_vtable>_> several_printables;
  undefined1 auStack_289c0 [8];
  printable_vtable ap_35;
  bye_printable bye_9;
  undefined1 auStack_28988 [8];
  printable_vtable ap_34;
  large_printable large_9;
  undefined1 auStack_26940 [8];
  printable_vtable ap_33;
  hi_printable hi_9;
  undefined1 auStack_26908 [8];
  printable_vtable ap_32;
  bye_printable bye_8;
  undefined1 auStack_268d0 [8];
  printable_vtable ap_31;
  large_printable large_8;
  undefined1 auStack_24888 [8];
  printable_vtable ap_30;
  undefined1 auStack_24858 [6];
  hi_printable hi_8;
  printable_vtable ap_29;
  undefined1 auStack_22818 [8];
  printable_vtable ap_28;
  undefined1 auStack_227e8 [8];
  printable_vtable ap_27;
  undefined1 auStack_227b8 [8];
  printable_vtable ap_26;
  undefined1 auStack_20778 [8];
  printable_vtable ap_25;
  undefined1 auStack_20748 [8];
  printable_vtable ap_24;
  undefined1 auStack_20718 [8];
  printable_vtable ap_23;
  undefined1 auStack_206e8 [7];
  bye_printable bye_7;
  undefined1 auStack_1e6d0 [8];
  printable_vtable ap_22;
  large_printable large_7;
  undefined1 auStack_1c688 [8];
  printable_vtable ap_21;
  undefined1 auStack_1c658 [7];
  hi_printable hi_7;
  printable_vtable ap_20;
  undefined1 auStack_1c628 [8];
  printable_vtable tmp_5;
  undefined1 auStack_1c5f8 [7];
  bye_printable bye_6;
  printable_vtable ap_19;
  undefined1 auStack_1a5b8 [8];
  printable_vtable tmp_4;
  large_printable large_6;
  printable_vtable ap_18;
  undefined1 auStack_18548 [8];
  printable_vtable tmp_3;
  undefined1 auStack_18518 [6];
  hi_printable hi_6;
  printable_vtable ap_17;
  undefined1 auStack_184e8 [7];
  bye_printable bye_5;
  undefined1 auStack_164d0 [8];
  printable_vtable ap_16;
  large_printable large_5;
  undefined1 auStack_14488 [8];
  printable_vtable ap_15;
  undefined1 auStack_14458 [6];
  hi_printable hi_5;
  printable_vtable ap_14;
  undefined1 auStack_14428 [7];
  bye_printable bye_4;
  undefined1 auStack_12410 [8];
  printable_vtable ap_13;
  large_printable large_4;
  undefined1 auStack_103c8 [8];
  printable_vtable ap_12;
  undefined1 auStack_10398 [6];
  hi_printable hi_4;
  printable_vtable ap_11;
  undefined1 auStack_10368 [7];
  bye_printable bye_3;
  undefined1 local_e350 [8];
  printable_vtable ap_10;
  large_printable large_3;
  undefined1 local_c308 [8];
  printable_vtable ap_9;
  undefined1 local_c2d8 [7];
  hi_printable hi_3;
  printable_vtable ap_8;
  undefined1 local_c2a8 [8];
  printable_vtable tmp_2;
  undefined1 local_c278 [7];
  bye_printable bye_2;
  printable_vtable ap_7;
  undefined1 local_a238 [8];
  printable_vtable tmp_1;
  large_printable large_2;
  printable_vtable ap_6;
  undefined1 local_81c8 [8];
  printable_vtable tmp;
  undefined1 local_8198 [6];
  hi_printable hi_2;
  printable_vtable ap_5;
  undefined1 local_8168 [7];
  bye_printable bye_1;
  undefined1 local_6150 [8];
  printable_vtable ap_4;
  large_printable large_1;
  undefined1 local_4108 [8];
  printable_vtable ap_3;
  undefined1 local_40d8 [6];
  hi_printable hi_1;
  printable_vtable ap_2;
  undefined1 local_40a8 [7];
  bye_printable bye;
  undefined1 local_2090 [8];
  printable_vtable ap_1;
  large_printable large;
  undefined1 local_38 [8];
  printable_vtable ap;
  hi_printable hi;
  
  ap.value_._4_4_ = 0;
  reset_allocations();
  poVar2 = std::operator<<((ostream *)&std::cout,"sizeof(printable_vtable) = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x28);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"hi_printable hi; printable_vtable ap(hi)");
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable<hi_printable>();
  printable_vtable::print((printable_vtable *)local_38);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)local_38);
  poVar2 = std::operator<<((ostream *)&std::cout,"large_printable large; printable_vtable ap(large)"
                          );
  std::operator<<(poVar2,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap_1.value_);
  large_printable::large_printable((large_printable *)local_40a8,(large_printable *)&ap_1.value_);
  printable_vtable::printable_vtable<large_printable>
            ((printable_vtable *)local_2090,(large_printable *)local_40a8);
  large_printable::~large_printable((large_printable *)local_40a8);
  printable_vtable::print((printable_vtable *)local_2090);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)local_2090);
  large_printable::~large_printable((large_printable *)&ap_1.value_);
  poVar2 = std::operator<<((ostream *)&std::cout,"bye_printable bye; printable_vtable ap(bye)");
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable<bye_printable>();
  printable_vtable::print((printable_vtable *)local_40d8);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)local_40d8);
  poVar2 = std::operator<<((ostream *)&std::cout,"hi_printable hi; printable_vtable ap = hi");
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable<hi_printable>();
  printable_vtable::print((printable_vtable *)local_4108);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)local_4108);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "large_printable large; printable_vtable ap = large");
  std::operator<<(poVar2,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap_4.value_);
  large_printable::large_printable((large_printable *)local_8168,(large_printable *)&ap_4.value_);
  printable_vtable::printable_vtable<large_printable>
            ((printable_vtable *)local_6150,(large_printable *)local_8168);
  large_printable::~large_printable((large_printable *)local_8168);
  printable_vtable::print((printable_vtable *)local_6150);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)local_6150);
  large_printable::~large_printable((large_printable *)&ap_4.value_);
  poVar2 = std::operator<<((ostream *)&std::cout,"bye_printable bye; printable_vtable ap = bye");
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable<bye_printable>();
  printable_vtable::print((printable_vtable *)local_8198);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)local_8198);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "hi_printable hi; printable_vtable tmp = hi; printable_vtable ap = tmp");
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable<hi_printable>();
  printable_vtable::printable_vtable
            ((printable_vtable *)(large_2.and_more_data_ + 0x3ff),(printable_vtable *)local_81c8);
  printable_vtable::print((printable_vtable *)(large_2.and_more_data_ + 0x3ff));
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)(large_2.and_more_data_ + 0x3ff));
  printable_vtable::~printable_vtable((printable_vtable *)local_81c8);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "large_printable large; printable_vtable tmp = large; printable_vtable ap = tmp"
                          );
  std::operator<<(poVar2,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&tmp_1.value_);
  large_printable::large_printable((large_printable *)&ap_7.value_,(large_printable *)&tmp_1.value_)
  ;
  printable_vtable::printable_vtable<large_printable>
            ((printable_vtable *)local_a238,(large_printable *)&ap_7.value_);
  large_printable::~large_printable((large_printable *)&ap_7.value_);
  printable_vtable::printable_vtable((printable_vtable *)local_c278,(printable_vtable *)local_a238);
  printable_vtable::print((printable_vtable *)local_c278);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)local_c278);
  printable_vtable::~printable_vtable((printable_vtable *)local_a238);
  large_printable::~large_printable((large_printable *)&tmp_1.value_);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "bye_printable bye; printable_vtable tmp = bye; printable_vtable ap = tmp"
                          );
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable<bye_printable>();
  printable_vtable::printable_vtable((printable_vtable *)local_c2d8,(printable_vtable *)local_c2a8);
  printable_vtable::print((printable_vtable *)local_c2d8);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)local_c2d8);
  printable_vtable::~printable_vtable((printable_vtable *)local_c2a8);
  poVar2 = std::operator<<((ostream *)&std::cout,"hi_printable hi; printable_vtable ap; ap = hi");
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable((printable_vtable *)local_c308);
  printable_vtable::operator=((printable_vtable *)local_c308);
  printable_vtable::print((printable_vtable *)local_c308);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)local_c308);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "large_printable large; printable_vtable ap; ap = large");
  std::operator<<(poVar2,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap_10.value_);
  printable_vtable::printable_vtable((printable_vtable *)local_e350);
  large_printable::large_printable
            ((large_printable *)auStack_10368,(large_printable *)&ap_10.value_);
  printable_vtable::operator=((printable_vtable *)local_e350,(large_printable *)auStack_10368);
  large_printable::~large_printable((large_printable *)auStack_10368);
  printable_vtable::print((printable_vtable *)local_e350);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)local_e350);
  large_printable::~large_printable((large_printable *)&ap_10.value_);
  poVar2 = std::operator<<((ostream *)&std::cout,"bye_printable bye; printable_vtable ap; ap = bye")
  ;
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable((printable_vtable *)auStack_10398);
  printable_vtable::operator=((printable_vtable *)auStack_10398);
  printable_vtable::print((printable_vtable *)auStack_10398);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_10398);
  poVar2 = std::operator<<((ostream *)&std::cout,"const hi_printable hi{}; printable_vtable ap(hi)")
  ;
  std::operator<<(poVar2,";\nap.print() = ");
  ap_12.value_._6_1_ = 0;
  printable_vtable::printable_vtable<hi_printable>();
  printable_vtable::print((printable_vtable *)auStack_103c8);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_103c8);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "const large_printable large{}; printable_vtable ap(large)");
  std::operator<<(poVar2,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap_13.value_);
  large_printable::large_printable
            ((large_printable *)auStack_14428,(large_printable *)&ap_13.value_);
  printable_vtable::printable_vtable<large_printable>
            ((printable_vtable *)auStack_12410,(large_printable *)auStack_14428);
  large_printable::~large_printable((large_printable *)auStack_14428);
  printable_vtable::print((printable_vtable *)auStack_12410);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_12410);
  large_printable::~large_printable((large_printable *)&ap_13.value_);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "const bye_printable bye{}; printable_vtable ap(bye)");
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable<bye_printable>();
  printable_vtable::print((printable_vtable *)auStack_14458);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_14458);
  poVar2 = std::operator<<((ostream *)&std::cout,"const hi_printable hi{}; printable_vtable ap = hi"
                          );
  std::operator<<(poVar2,";\nap.print() = ");
  ap_15.value_._6_1_ = 0;
  printable_vtable::printable_vtable<hi_printable>();
  printable_vtable::print((printable_vtable *)auStack_14488);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_14488);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "const large_printable large{}; printable_vtable ap = large");
  std::operator<<(poVar2,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap_16.value_);
  large_printable::large_printable
            ((large_printable *)auStack_184e8,(large_printable *)&ap_16.value_);
  printable_vtable::printable_vtable<large_printable>
            ((printable_vtable *)auStack_164d0,(large_printable *)auStack_184e8);
  large_printable::~large_printable((large_printable *)auStack_184e8);
  printable_vtable::print((printable_vtable *)auStack_164d0);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_164d0);
  large_printable::~large_printable((large_printable *)&ap_16.value_);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "const bye_printable bye{}; printable_vtable ap = bye");
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable<bye_printable>();
  printable_vtable::print((printable_vtable *)auStack_18518);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_18518);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "const hi_printable hi{}; printable_vtable tmp = hi; printable_vtable ap = tmp"
                          );
  std::operator<<(poVar2,";\nap.print() = ");
  tmp_3.value_._6_1_ = 0;
  printable_vtable::printable_vtable<hi_printable>();
  printable_vtable::printable_vtable
            ((printable_vtable *)(large_6.and_more_data_ + 0x3ff),(printable_vtable *)auStack_18548)
  ;
  printable_vtable::print((printable_vtable *)(large_6.and_more_data_ + 0x3ff));
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)(large_6.and_more_data_ + 0x3ff));
  printable_vtable::~printable_vtable((printable_vtable *)auStack_18548);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "const large_printable large{}; printable_vtable tmp = large; printable_vtable ap = tmp"
                          );
  std::operator<<(poVar2,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&tmp_4.value_);
  large_printable::large_printable
            ((large_printable *)&ap_19.value_,(large_printable *)&tmp_4.value_);
  printable_vtable::printable_vtable<large_printable>
            ((printable_vtable *)auStack_1a5b8,(large_printable *)&ap_19.value_);
  large_printable::~large_printable((large_printable *)&ap_19.value_);
  printable_vtable::printable_vtable
            ((printable_vtable *)auStack_1c5f8,(printable_vtable *)auStack_1a5b8);
  printable_vtable::print((printable_vtable *)auStack_1c5f8);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_1c5f8);
  printable_vtable::~printable_vtable((printable_vtable *)auStack_1a5b8);
  large_printable::~large_printable((large_printable *)&tmp_4.value_);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "const bye_printable bye{}; printable_vtable tmp = bye; printable_vtable ap = tmp"
                          );
  std::operator<<(poVar2,";\nap.print() = ");
  tmp_5.value_._7_1_ = 0;
  printable_vtable::printable_vtable<bye_printable>();
  printable_vtable::printable_vtable
            ((printable_vtable *)auStack_1c658,(printable_vtable *)auStack_1c628);
  printable_vtable::print((printable_vtable *)auStack_1c658);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_1c658);
  printable_vtable::~printable_vtable((printable_vtable *)auStack_1c628);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "const hi_printable hi{}; printable_vtable ap; ap = hi");
  std::operator<<(poVar2,";\nap.print() = ");
  ap_21.value_._7_1_ = 0;
  printable_vtable::printable_vtable((printable_vtable *)auStack_1c688);
  printable_vtable::operator=((printable_vtable *)auStack_1c688);
  printable_vtable::print((printable_vtable *)auStack_1c688);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_1c688);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "const large_printable large{}; printable_vtable ap; ap = large");
  std::operator<<(poVar2,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap_22.value_);
  printable_vtable::printable_vtable((printable_vtable *)auStack_1e6d0);
  large_printable::large_printable
            ((large_printable *)auStack_206e8,(large_printable *)&ap_22.value_);
  printable_vtable::operator=((printable_vtable *)auStack_1e6d0,(large_printable *)auStack_206e8);
  large_printable::~large_printable((large_printable *)auStack_206e8);
  printable_vtable::print((printable_vtable *)auStack_1e6d0);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_1e6d0);
  large_printable::~large_printable((large_printable *)&ap_22.value_);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "const bye_printable bye{}; printable_vtable ap; ap = bye");
  std::operator<<(poVar2,";\nap.print() = ");
  ap_23.value_._7_1_ = 0;
  printable_vtable::printable_vtable((printable_vtable *)auStack_20718);
  printable_vtable::operator=((printable_vtable *)auStack_20718);
  printable_vtable::print((printable_vtable *)auStack_20718);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_20718);
  poVar2 = std::operator<<((ostream *)&std::cout,"printable_vtable ap(hi_printable{})");
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable<hi_printable>();
  printable_vtable::print((printable_vtable *)auStack_20748);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_20748);
  poVar2 = std::operator<<((ostream *)&std::cout,"printable_vtable ap(large_printable{})");
  std::operator<<(poVar2,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap_26.value_);
  printable_vtable::printable_vtable<large_printable>
            ((printable_vtable *)auStack_20778,(large_printable *)&ap_26.value_);
  large_printable::~large_printable((large_printable *)&ap_26.value_);
  printable_vtable::print((printable_vtable *)auStack_20778);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_20778);
  poVar2 = std::operator<<((ostream *)&std::cout,"printable_vtable ap(bye_printable{})");
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable<bye_printable>();
  printable_vtable::print((printable_vtable *)auStack_227b8);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_227b8);
  poVar2 = std::operator<<((ostream *)&std::cout,"printable_vtable ap = hi_printable{}");
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable<hi_printable>();
  printable_vtable::print((printable_vtable *)auStack_227e8);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_227e8);
  poVar2 = std::operator<<((ostream *)&std::cout,"printable_vtable ap = large_printable{}");
  std::operator<<(poVar2,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap_29.value_);
  printable_vtable::printable_vtable<large_printable>
            ((printable_vtable *)auStack_22818,(large_printable *)&ap_29.value_);
  large_printable::~large_printable((large_printable *)&ap_29.value_);
  printable_vtable::print((printable_vtable *)auStack_22818);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_22818);
  poVar2 = std::operator<<((ostream *)&std::cout,"printable_vtable ap = bye_printable{}");
  std::operator<<(poVar2,";\nap.print() = ");
  printable_vtable::printable_vtable<bye_printable>();
  printable_vtable::print((printable_vtable *)auStack_24858);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_24858);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "hi_printable hi; printable_vtable ap(std::ref(hi))");
  std::operator<<(poVar2,";\nap.print() = ");
  value = std::ref<hi_printable>((hi_printable *)((long)&ap_30.value_ + 6));
  printable_vtable::printable_vtable<std::reference_wrapper<hi_printable>>
            ((printable_vtable *)auStack_24888,value);
  printable_vtable::print((printable_vtable *)auStack_24888);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_24888);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "large_printable large; printable_vtable ap(std::ref(large))");
  std::operator<<(poVar2,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap_31.value_);
  value_00 = std::ref<large_printable>((large_printable *)&ap_31.value_);
  printable_vtable::printable_vtable<std::reference_wrapper<large_printable>>
            ((printable_vtable *)auStack_268d0,value_00);
  printable_vtable::print((printable_vtable *)auStack_268d0);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_268d0);
  large_printable::~large_printable((large_printable *)&ap_31.value_);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "bye_printable bye; printable_vtable ap(std::ref(bye))");
  std::operator<<(poVar2,";\nap.print() = ");
  value_01 = std::ref<bye_printable>((bye_printable *)((long)&ap_32.value_ + 7));
  printable_vtable::printable_vtable<std::reference_wrapper<bye_printable>>
            ((printable_vtable *)auStack_26908,value_01);
  printable_vtable::print((printable_vtable *)auStack_26908);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_26908);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "hi_printable hi; printable_vtable ap(std::cref(hi))");
  std::operator<<(poVar2,";\nap.print() = ");
  value_02 = std::cref<hi_printable>((hi_printable *)((long)&ap_33.value_ + 7));
  printable_vtable::printable_vtable<std::reference_wrapper<hi_printable_const>>
            ((printable_vtable *)auStack_26940,value_02);
  printable_vtable::print((printable_vtable *)auStack_26940);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_26940);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "large_printable large; printable_vtable ap(std::cref(large))");
  std::operator<<(poVar2,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap_34.value_);
  value_03 = std::cref<large_printable>((large_printable *)&ap_34.value_);
  printable_vtable::printable_vtable<std::reference_wrapper<large_printable_const>>
            ((printable_vtable *)auStack_28988,value_03);
  printable_vtable::print((printable_vtable *)auStack_28988);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_28988);
  large_printable::~large_printable((large_printable *)&ap_34.value_);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "bye_printable bye; printable_vtable ap(std::cref(bye))");
  std::operator<<(poVar2,";\nap.print() = ");
  several_printables.super__Vector_base<printable_vtable,_std::allocator<printable_vtable>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (pointer)std::cref<bye_printable>((bye_printable *)((long)&ap_35.value_ + 7));
  printable_vtable::printable_vtable<std::reference_wrapper<bye_printable_const>>
            ((printable_vtable *)auStack_289c0,
             (reference_wrapper<const_bye_printable>)
             several_printables.
             super__Vector_base<printable_vtable,_std::allocator<printable_vtable>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  printable_vtable::print((printable_vtable *)auStack_289c0);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  printable_vtable::~printable_vtable((printable_vtable *)auStack_289c0);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "copied vector<printable_vtable>{hi_printable, large_printable}");
  std::operator<<(poVar2,"\n");
  __range1._7_1_ = 1;
  ppStack_28a48 = &pStack_28a40;
  printable_vtable::printable_vtable<hi_printable>();
  ppStack_28a48 = &pStack_28a18;
  large_printable::large_printable(&lStack_2aa68);
  printable_vtable::printable_vtable<large_printable>(&pStack_28a18,&lStack_2aa68);
  __range1._7_1_ = 0;
  auStack_289f0._0_8_ = &pStack_28a40;
  auStack_289f0._8_8_ = (_func_void *)0x2;
  std::allocator<printable_vtable>::allocator((allocator<printable_vtable> *)((long)&__range1 + 6));
  __l_00._M_len = auStack_289f0._8_8_;
  __l_00._M_array = (iterator)auStack_289f0._0_8_;
  std::vector<printable_vtable,_std::allocator<printable_vtable>_>::vector
            ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)(auStack_289f0 + 0x10),
             __l_00,(allocator<printable_vtable> *)((long)&__range1 + 6));
  std::allocator<printable_vtable>::~allocator((allocator<printable_vtable> *)((long)&__range1 + 6))
  ;
  ppStack_2d030 = (printable_vtable *)auStack_289f0;
  do {
    ppStack_2d030 = ppStack_2d030 + -1;
    printable_vtable::~printable_vtable(ppStack_2d030);
  } while (ppStack_2d030 != &pStack_28a40);
  large_printable::~large_printable(&lStack_2aa68);
  __end1 = std::vector<printable_vtable,_std::allocator<printable_vtable>_>::begin
                     ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)
                      (auStack_289f0 + 0x10));
  printable = (printable_vtable *)
              std::vector<printable_vtable,_std::allocator<printable_vtable>_>::end
                        ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)
                         (auStack_289f0 + 0x10));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<printable_vtable_*,_std::vector<printable_vtable,_std::allocator<printable_vtable>_>_>
                                *)&printable);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<printable_vtable_*,_std::vector<printable_vtable,_std::allocator<printable_vtable>_>_>
           ::operator*(&__end1);
    printable_vtable::print(this);
    __gnu_cxx::
    __normal_iterator<printable_vtable_*,_std::vector<printable_vtable,_std::allocator<printable_vtable>_>_>
    ::operator++(&__end1);
  }
  std::vector<printable_vtable,_std::allocator<printable_vtable>_>::vector
            ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)
             &several_printables_1.
              super__Vector_base<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<printable_vtable,_std::allocator<printable_vtable>_> *)(auStack_289f0 + 0x10));
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  std::vector<printable_vtable,_std::allocator<printable_vtable>_>::~vector
            ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)
             &several_printables_1.
              super__Vector_base<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<printable_vtable,_std::allocator<printable_vtable>_>::~vector
            ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)(auStack_289f0 + 0x10));
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "copied vector<COW<printable_vtable>>{hi_printable, large_printable}");
  std::operator<<(poVar2,"\n");
  __range1_1._7_1_ = 1;
  pcStack_2aaf8 = (copy_on_write<printable_vtable> *)auStack_2aaf0;
  printable_vtable::printable_vtable<hi_printable>(&pStack_2ab20);
  copy_on_write<printable_vtable>::copy_on_write
            ((copy_on_write<printable_vtable> *)auStack_2aaf0,&pStack_2ab20);
  pcStack_2aaf8 = (copy_on_write<printable_vtable> *)(auStack_2aaf0 + 0x10);
  large_printable::large_printable(&lStack_2cb68);
  printable_vtable::printable_vtable<large_printable>(&pStack_2ab50,&lStack_2cb68);
  copy_on_write<printable_vtable>::copy_on_write
            ((copy_on_write<printable_vtable> *)(auStack_2aaf0 + 0x10),&pStack_2ab50);
  __range1_1._7_1_ = 0;
  cStack_2aad0.impl_.super___shared_ptr<printable_vtable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auStack_2aaf0;
  cStack_2aad0.impl_.super___shared_ptr<printable_vtable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  std::allocator<copy_on_write<printable_vtable>_>::allocator
            ((allocator<copy_on_write<printable_vtable>_> *)((long)&__range1_1 + 6));
  __l._M_len = (size_type)
               cStack_2aad0.impl_.super___shared_ptr<printable_vtable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 cStack_2aad0.impl_.super___shared_ptr<printable_vtable,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
  std::vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>::
  vector((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
          *)auStack_2aac0,__l,(allocator<copy_on_write<printable_vtable>_> *)((long)&__range1_1 + 6)
        );
  std::allocator<copy_on_write<printable_vtable>_>::~allocator
            ((allocator<copy_on_write<printable_vtable>_> *)((long)&__range1_1 + 6));
  pcStack_2d098 = &cStack_2aad0;
  do {
    pcStack_2d098 = pcStack_2d098 + -1;
    copy_on_write<printable_vtable>::~copy_on_write(pcStack_2d098);
  } while (pcStack_2d098 != (copy_on_write<printable_vtable> *)auStack_2aaf0);
  printable_vtable::~printable_vtable(&pStack_2ab50);
  large_printable::~large_printable(&lStack_2cb68);
  printable_vtable::~printable_vtable(&pStack_2ab20);
  __end1_1 = std::
             vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
             ::begin((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
                      *)auStack_2aac0);
  printable_1 = (copy_on_write<printable_vtable> *)
                std::
                vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
                ::end((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
                       *)auStack_2aac0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<copy_on_write<printable_vtable>_*,_std::vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>_>
                        *)&printable_1);
    if (!bVar1) break;
    several_printables_copy_1.
    super__Vector_base<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         __gnu_cxx::
         __normal_iterator<copy_on_write<printable_vtable>_*,_std::vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>_>
         ::operator*(&__end1_1);
    this_00 = copy_on_write<printable_vtable>::operator->
                        (several_printables_copy_1.
                         super__Vector_base<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    printable_vtable::print(this_00);
    __gnu_cxx::
    __normal_iterator<copy_on_write<printable_vtable>_*,_std::vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>_>
    ::operator++(&__end1_1);
  }
  std::vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>::
  vector((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
          *)auStack_2cba8,
         (vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
          *)auStack_2aac0);
  poVar2 = std::operator<<((ostream *)&std::cout,"allocations: ");
  psVar3 = allocations();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*psVar3);
  std::operator<<(poVar2,"\n\n");
  reset_allocations();
  std::vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>::
  ~vector((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
           *)auStack_2cba8);
  std::vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>::
  ~vector((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
           *)auStack_2aac0);
  return 0;
}

Assistant:

int main ()
{
#if INSTRUMENT_COPIES
    reset_allocations();
#endif

    std::cout << "sizeof(printable_vtable) = " << sizeof(printable_vtable) << "\n";

#define ECHO(expr)                                                      \
    do {                                                                \
        std::cout << #expr << ";\nap.print() = ";                       \
        expr;                                                           \
        ap.print();                                                     \
        std::cout << "allocations: " << allocations() << "\n\n";        \
        reset_allocations();                                            \
    } while (false)

    ECHO(hi_printable hi; printable_vtable ap(hi));
    ECHO(large_printable large; printable_vtable ap(large));
    ECHO(bye_printable bye; printable_vtable ap(bye));

    ECHO(hi_printable hi; printable_vtable ap = hi);
    ECHO(large_printable large; printable_vtable ap = large);
    ECHO(bye_printable bye; printable_vtable ap = bye);

    ECHO(hi_printable hi; printable_vtable tmp = hi; printable_vtable ap = tmp);
    ECHO(large_printable large; printable_vtable tmp = large; printable_vtable ap = tmp);
    ECHO(bye_printable bye; printable_vtable tmp = bye; printable_vtable ap = tmp);

    ECHO(hi_printable hi; printable_vtable ap; ap = hi);
    ECHO(large_printable large; printable_vtable ap; ap = large);
    ECHO(bye_printable bye; printable_vtable ap; ap = bye);

    ECHO(const hi_printable hi{}; printable_vtable ap(hi));
    ECHO(const large_printable large{}; printable_vtable ap(large));
    ECHO(const bye_printable bye{}; printable_vtable ap(bye));

    ECHO(const hi_printable hi{}; printable_vtable ap = hi);
    ECHO(const large_printable large{}; printable_vtable ap = large);
    ECHO(const bye_printable bye{}; printable_vtable ap = bye);

    ECHO(const hi_printable hi{}; printable_vtable tmp = hi; printable_vtable ap = tmp);
    ECHO(const large_printable large{}; printable_vtable tmp = large; printable_vtable ap = tmp);
    ECHO(const bye_printable bye{}; printable_vtable tmp = bye; printable_vtable ap = tmp);

    ECHO(const hi_printable hi{}; printable_vtable ap; ap = hi);
    ECHO(const large_printable large{}; printable_vtable ap; ap = large);
    ECHO(const bye_printable bye{}; printable_vtable ap; ap = bye);

    ECHO(printable_vtable ap(hi_printable{}));
    ECHO(printable_vtable ap(large_printable{}));
    ECHO(printable_vtable ap(bye_printable{}));

    ECHO(printable_vtable ap = hi_printable{});
    ECHO(printable_vtable ap = large_printable{});
    ECHO(printable_vtable ap = bye_printable{});

    ECHO(hi_printable hi; printable_vtable ap(std::ref(hi)));
    ECHO(large_printable large; printable_vtable ap(std::ref(large)));
    ECHO(bye_printable bye; printable_vtable ap(std::ref(bye)));

    ECHO(hi_printable hi; printable_vtable ap(std::cref(hi)));
    ECHO(large_printable large; printable_vtable ap(std::cref(large)));
    ECHO(bye_printable bye; printable_vtable ap(std::cref(bye)));

#undef ECHO

    {
        std::cout << "copied vector<printable_vtable>{hi_printable, large_printable}" << "\n";

        std::vector<printable_vtable> several_printables = {
            hi_printable{},
            large_printable{}
        };

        for (const auto & printable : several_printables) {
            printable.print();
        }

        std::vector<printable_vtable> several_printables_copy = several_printables;

        std::cout << "allocations: " << allocations() << "\n\n";
        reset_allocations();
    }

    {
        std::cout << "copied vector<COW<printable_vtable>>{hi_printable, large_printable}" << "\n";

        std::vector<copy_on_write<printable_vtable>> several_printables = {
            {hi_printable{}},
            {large_printable{}}
        };

        for (const auto & printable : several_printables) {
            printable->print();
        }

        std::vector<copy_on_write<printable_vtable>> several_printables_copy = several_printables;

        std::cout << "allocations: " << allocations() << "\n\n";
        reset_allocations();
    }

    return 0;
}